

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_authentication(Curl_easy *data,connectdata *conn)

{
  _Bool _Var1;
  saslprogress local_34;
  anon_union_280_10_9f9d5394_for_proto *paStack_30;
  saslprogress progress;
  pop3_conn *pop3c;
  connectdata *pcStack_20;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pop3c._4_4_ = CURLE_OK;
  paStack_30 = &conn->proto;
  local_34 = SASL_IDLE;
  pcStack_20 = conn;
  conn_local = (connectdata *)data;
  _Var1 = Curl_sasl_can_authenticate((SASL *)&(conn->proto).imapc.sasl.authmechs,data);
  if (_Var1) {
    if (((((paStack_30->pop3c).authtypes & (paStack_30->pop3c).preftype & 4) != 0) &&
        (pop3c._4_4_ = Curl_sasl_start((SASL *)&(paStack_30->imapc).sasl.authmechs,
                                       (Curl_easy *)conn_local,false,&local_34),
        pop3c._4_4_ == CURLE_OK)) && (local_34 == SASL_INPROGRESS)) {
      pop3_state((Curl_easy *)conn_local,POP3_AUTH);
    }
    if ((pop3c._4_4_ == CURLE_OK) && (local_34 == SASL_IDLE)) {
      if (((paStack_30->pop3c).authtypes & (paStack_30->pop3c).preftype & 2) == 0) {
        if (((paStack_30->pop3c).authtypes & (paStack_30->pop3c).preftype & 1) == 0) {
          if (((conn_local != (connectdata *)0x0) &&
              ((*(ulong *)((long)&conn_local[1].proto.ftpc.prevpath + 2) >> 0x1c & 1) != 0)) &&
             ((*(long *)&conn_local[3].shutdown.timeout_ms == 0 ||
              (0 < *(int *)(*(long *)&conn_local[3].shutdown.timeout_ms + 8))))) {
            Curl_infof((Curl_easy *)conn_local,"No known authentication mechanisms supported");
          }
          pop3c._4_4_ = CURLE_LOGIN_DENIED;
        }
        else {
          pop3c._4_4_ = pop3_perform_user((Curl_easy *)conn_local,pcStack_20);
        }
      }
      else {
        pop3c._4_4_ = pop3_perform_apop((Curl_easy *)conn_local,pcStack_20);
      }
    }
    data_local._4_4_ = pop3c._4_4_;
  }
  else {
    pop3_state((Curl_easy *)conn_local,POP3_STOP);
    data_local._4_4_ = pop3c._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode pop3_perform_authentication(struct Curl_easy *data,
                                            struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  saslprogress progress = SASL_IDLE;

  /* Check we have enough data to authenticate with and end the
     connect phase if we do not */
  if(!Curl_sasl_can_authenticate(&pop3c->sasl, data)) {
    pop3_state(data, POP3_STOP);
    return result;
  }

  if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_SASL) {
    /* Calculate the SASL login details */
    result = Curl_sasl_start(&pop3c->sasl, data, FALSE, &progress);

    if(!result)
      if(progress == SASL_INPROGRESS)
        pop3_state(data, POP3_AUTH);
  }

  if(!result && progress == SASL_IDLE) {
#ifndef CURL_DISABLE_DIGEST_AUTH
    if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_APOP)
      /* Perform APOP authentication */
      result = pop3_perform_apop(data, conn);
    else
#endif
    if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_CLEARTEXT)
      /* Perform clear text authentication */
      result = pop3_perform_user(data, conn);
    else {
      /* Other mechanisms not supported */
      infof(data, "No known authentication mechanisms supported");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}